

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O2

void print_AttributeInfo(attribute_info attributeInfo,uint32_t index,cp_info *constantPool,
                        uint8_t indentation)

{
  uint8_t n;
  uint8_t n_00;
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  u2 uVar5;
  u2 index_00;
  u2 accessFlags;
  u1 *puVar6;
  FILE *pFVar7;
  bool bVar8;
  char *pcVar9;
  ostream *poVar10;
  u2 *puVar11;
  uint uVar12;
  Utils *this;
  uint16_t i_1;
  uint16_t i;
  ulong uVar13;
  uint16_t i_3;
  CONSTANT_Utf8_info constant;
  CONSTANT_Utf8_info constant_00;
  CONSTANT_Utf8_info constant_01;
  CONSTANT_Utf8_info constant_02;
  CONSTANT_Utf8_info constant_03;
  CONSTANT_Utf8_info constant_04;
  CONSTANT_Utf8_info constant_05;
  CONSTANT_Utf8_info constant_06;
  CONSTANT_Utf8_info constant_07;
  
  pcVar9 = getFormattedConstant(constantPool,attributeInfo.attribute_name_index);
  Utils::printTabs(out,indentation);
  fprintf((FILE *)out,"[%d] %s\n",index);
  n = indentation + '\x01';
  Utils::printTabs(out,n);
  fprintf((FILE *)out,"Attribute name index:\t cp_info #%d\n",
          (ulong)attributeInfo.attribute_name_index);
  Utils::printTabs(out,n);
  fprintf((FILE *)out,"Attribute length:\t %d\n",(ulong)attributeInfo.attribute_length);
  uVar1 = constantPool[(ulong)attributeInfo.attribute_name_index - 1].info.fieldref_info.class_index
  ;
  this = (Utils *)(ulong)uVar1;
  puVar6 = constantPool[(ulong)attributeInfo.attribute_name_index - 1].info.utf8_info.bytes;
  constant.bytes = (u1 *)"ConstantValue";
  constant._0_8_ = puVar6;
  bVar8 = Utils::compareUtf8WithString(this,constant,pcVar9);
  if (!bVar8) {
    constant_00.bytes = (u1 *)"Code";
    constant_00._0_8_ = puVar6;
    bVar8 = Utils::compareUtf8WithString((Utils *)(ulong)uVar1,constant_00,pcVar9);
    if (bVar8) {
      Utils::printTabs(out,n);
      fprintf((FILE *)out,"Maximum stack depth:\t %d\n",
              (ulong)attributeInfo.info.code_info.max_stack);
      Utils::printTabs(out,n);
      fprintf((FILE *)out,"Maximum local variables: %d\n",
              (ulong)attributeInfo.info.code_info.max_locals);
      Utils::printTabs(out,n);
      fprintf((FILE *)out,"Code length:\t\t %u\n",(ulong)attributeInfo.info.code_info.code_length);
      Utils::printTabs(out,n);
      fwrite("Exception table:\n",0x11,1,(FILE *)out);
      n_00 = indentation + '\x02';
      Utils::printTabs(out,n_00);
      if ((ulong)attributeInfo.info.code_info.exception_table_length == 0) {
        fwrite("Exception table is empty.\n",0x1a,1,(FILE *)out);
      }
      else {
        fwrite("Nr.\t start_pc\t end_pc\t handler_pc\t catch_type\t verbose\n",0x37,1,(FILE *)out);
        for (uVar13 = 0; attributeInfo.info.code_info.exception_table_length != uVar13;
            uVar13 = uVar13 + 1) {
          uVar1 = attributeInfo.info.code_info.exception_table[uVar13].start_pc;
          uVar2 = attributeInfo.info.code_info.exception_table[uVar13].end_pc;
          uVar3 = attributeInfo.info.code_info.exception_table[uVar13].handler_pc;
          uVar4 = attributeInfo.info.code_info.exception_table[uVar13].catch_type;
          Utils::printTabs(out,n_00);
          fprintf((FILE *)out,"%d\t ",uVar13 & 0xffffffff);
          fprintf((FILE *)out,"%d\t ",(ulong)uVar1);
          fprintf((FILE *)out,"%d\t ",(ulong)uVar2);
          fprintf((FILE *)out,"%d\t ",(ulong)uVar3);
          if (uVar4 == 0) {
            fwrite("0\n",2,1,(FILE *)out);
          }
          else {
            fprintf((FILE *)out,"cp_info #%d\t ",(ulong)uVar4);
            pFVar7 = out;
            pcVar9 = getFormattedConstant(constantPool,uVar4);
            fprintf((FILE *)pFVar7,"%s\n",pcVar9);
          }
        }
      }
      Utils::printTabs(out,n);
      fwrite("Bytecode:\n",10,1,(FILE *)out);
      printByteCode(attributeInfo.info.code_info,constantPool,n_00);
      Utils::printTabs(out,n);
      fwrite("Attributes:\n",0xc,1,(FILE *)out);
      for (uVar13 = 0; attributeInfo.info.code_info.attributes_count != uVar13; uVar13 = uVar13 + 1)
      {
        print_AttributeInfo(*attributeInfo.info.code_info.attributes,(uint32_t)uVar13,constantPool,
                            n_00);
        attributeInfo.info.code_info.attributes =
             (attribute_info *)((long)attributeInfo.info.code_info.attributes + 0x38);
      }
      goto LAB_00112a41;
    }
    uVar12 = (uint)uVar1;
    constant_01.bytes = (u1 *)"Exceptions";
    constant_01._0_8_ = puVar6;
    bVar8 = Utils::compareUtf8WithString(this,constant_01,pcVar9);
    if (bVar8) {
      Utils::printTabs(out,n);
      fwrite("Nr.\t exception\t verbose\n",0x18,1,(FILE *)out);
      for (uVar13 = 0; attributeInfo.info.code_info.max_stack != uVar13; uVar13 = uVar13 + 1) {
        Utils::printTabs(out,n);
        fprintf((FILE *)out,"%d\t ",uVar13 & 0xffffffff);
        fprintf((FILE *)out,"cp_info #%d\t ",
                (ulong)*(ushort *)(attributeInfo.info.code_info.code + uVar13 * 2));
        pFVar7 = out;
        pcVar9 = getFormattedConstant
                           (constantPool,*(u2 *)(attributeInfo.info.code_info.code + uVar13 * 2));
        fprintf((FILE *)pFVar7,"%s\n",pcVar9);
      }
      goto LAB_00112a41;
    }
    constant_02.bytes = (u1 *)"InnerClasses";
    constant_02._0_8_ = puVar6;
    bVar8 = Utils::compareUtf8WithString((Utils *)(ulong)uVar12,constant_02,pcVar9);
    if (bVar8) {
      Utils::printTabs(out,n);
      fwrite("Nr.\t inner_class\t outer_class\t inner_name\t access flags\n",0x38,1,(FILE *)out);
      for (uVar13 = 0; attributeInfo.info.code_info.max_stack != uVar13; uVar13 = uVar13 + 1) {
        uVar5 = *(u2 *)(attributeInfo.info.code_info.code + uVar13 * 8);
        index_00 = *(u2 *)(attributeInfo.info.code_info.code + uVar13 * 8 + 2);
        uVar1 = *(ushort *)(attributeInfo.info.code_info.code + uVar13 * 8 + 4);
        accessFlags = *(u2 *)(attributeInfo.info.code_info.code + uVar13 * 8 + 6);
        Utils::printTabs(out,n);
        fprintf((FILE *)out,"%d\t ",uVar13 & 0xffffffff);
        pFVar7 = out;
        pcVar9 = getFormattedConstant(constantPool,uVar5);
        fprintf((FILE *)pFVar7,"cp_info #%d <%s>\t ",(ulong)uVar5,pcVar9);
        pFVar7 = out;
        pcVar9 = getFormattedConstant(constantPool,index_00);
        fprintf((FILE *)pFVar7,"cp_info #%d <%s>\t ",(ulong)index_00,pcVar9);
        pFVar7 = out;
        pcVar9 = getFormattedConstant(constantPool,uVar1);
        fprintf((FILE *)pFVar7,"cp_info #%d <%s>\t ",(ulong)uVar1,pcVar9);
        pFVar7 = out;
        pcVar9 = getAccessFlags(accessFlags);
        fprintf((FILE *)pFVar7,"0x%.4X [%s]\n",(ulong)accessFlags,pcVar9);
      }
      goto LAB_00112a41;
    }
    constant_03.bytes = (u1 *)"Synthetic";
    constant_03._0_8_ = puVar6;
    bVar8 = Utils::compareUtf8WithString((Utils *)(ulong)uVar12,constant_03,pcVar9);
    if (bVar8) goto LAB_00112a41;
    constant_04.bytes = (u1 *)"SourceFile";
    constant_04._0_8_ = puVar6;
    bVar8 = Utils::compareUtf8WithString((Utils *)(ulong)uVar12,constant_04,pcVar9);
    if (!bVar8) {
      constant_05.bytes = (u1 *)"LineNumberTable";
      constant_05._0_8_ = puVar6;
      bVar8 = Utils::compareUtf8WithString(this,constant_05,pcVar9);
      if (bVar8) {
        Utils::printTabs(out,n);
        fwrite("Nr.\t start_pc\t line_number\n",0x1b,1,(FILE *)out);
        for (uVar13 = 0; attributeInfo.info.code_info.max_stack != uVar13; uVar13 = uVar13 + 1) {
          uVar1 = *(ushort *)(attributeInfo.info.code_info.code + uVar13 * 4);
          uVar2 = *(ushort *)(attributeInfo.info.code_info.code + uVar13 * 4 + 2);
          Utils::printTabs(out,n);
          fprintf((FILE *)out,"%d\t ",uVar13 & 0xffffffff);
          fprintf((FILE *)out,"%d\t ",(ulong)uVar1);
          fprintf((FILE *)out,"%d\n",(ulong)uVar2);
        }
      }
      else {
        constant_06.bytes = (u1 *)"LocalVariableTable";
        constant_06._0_8_ = puVar6;
        bVar8 = Utils::compareUtf8WithString((Utils *)(ulong)(uint)uVar1,constant_06,pcVar9);
        if (bVar8) {
          Utils::printTabs(out,n);
          fwrite("Nr.\t start_pc\t length\t index\t name\t descriptor\n",0x2f,1,(FILE *)out);
          puVar11 = &(attributeInfo.info.localVariableTable_info.localVariableTable)->index;
          for (uVar13 = 0; attributeInfo.info.code_info.max_stack != uVar13; uVar13 = uVar13 + 1) {
            uVar1 = ((LocalVariableTable *)(puVar11 + -4))->start_pc;
            uVar2 = puVar11[-3];
            uVar3 = puVar11[-2];
            uVar5 = puVar11[-1];
            uVar4 = *puVar11;
            Utils::printTabs(out,n);
            fprintf((FILE *)out,"%d\t ",uVar13 & 0xffffffff);
            fprintf((FILE *)out,"%d\t ",(ulong)uVar1);
            fprintf((FILE *)out,"%d\t ",(ulong)uVar2);
            fprintf((FILE *)out,"%d\t ",(ulong)uVar4);
            pFVar7 = out;
            pcVar9 = getFormattedConstant(constantPool,uVar3);
            fprintf((FILE *)pFVar7,"cp_info #%d <%s>\t ",(ulong)uVar3,pcVar9);
            pFVar7 = out;
            pcVar9 = getFormattedConstant(constantPool,uVar5);
            fprintf((FILE *)pFVar7,"cp_info #%d <%s>\n",(ulong)uVar5,pcVar9);
            puVar11 = puVar11 + 5;
          }
        }
        else {
          constant_07.bytes = (u1 *)"Deprecated";
          constant_07._0_8_ = puVar6;
          bVar8 = Utils::compareUtf8WithString((Utils *)(ulong)(uint)uVar1,constant_07,pcVar9);
          if (!bVar8) {
            poVar10 = std::operator<<((ostream *)&std::cerr,
                                      "Arquivo .class possui uma um atributo invalido.");
            std::endl<char,std::char_traits<char>>(poVar10);
            exit(6);
          }
        }
      }
      goto LAB_00112a41;
    }
  }
  Utils::printTabs(out,n);
  pFVar7 = out;
  pcVar9 = getFormattedConstant(constantPool,attributeInfo.info.code_info.max_stack);
  fprintf((FILE *)pFVar7,"Constant value index:\t cp_info #%d <%s>\n",
          (ulong)attributeInfo.info.code_info.max_stack,pcVar9);
LAB_00112a41:
  fputc(10,(FILE *)out);
  return;
}

Assistant:

void print_AttributeInfo(attribute_info attributeInfo, uint32_t index, cp_info *constantPool, uint8_t indentation) {    
    const char *attributeName = getFormattedConstant(constantPool, attributeInfo.attribute_name_index);
    Utils::printTabs(out, indentation);
    fprintf(out,"[%d] %s\n", index, attributeName);
    Utils::printTabs(out, indentation+1);
    fprintf(out,"Attribute name index:\t cp_info #%d\n", attributeInfo.attribute_name_index);
    Utils::printTabs(out, indentation+1);
    fprintf(out,"Attribute length:\t %d\n", attributeInfo.attribute_length);
    
    CONSTANT_Utf8_info attributeUtf8 = constantPool[attributeInfo.attribute_name_index-1].info.utf8_info;
    if (Utils::compareUtf8WithString(attributeUtf8, "ConstantValue")) {
        ConstantValue_attribute constantValue = attributeInfo.info.constantValue_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Constant value index:\t cp_info #%d <%s>\n", constantValue.constantvalue_index, getFormattedConstant(constantPool, constantValue.constantvalue_index));
    } else if (Utils::compareUtf8WithString(attributeUtf8, "Code")) {
        Code_attribute code = attributeInfo.info.code_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Maximum stack depth:\t %d\n", code.max_stack);
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Maximum local variables: %d\n", code.max_locals);
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Code length:\t\t %u\n", code.code_length);
        
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Exception table:\n");
        Utils::printTabs(out, indentation+2);
        if (code.exception_table_length > 0) {
            fprintf(out,"Nr.\t start_pc\t end_pc\t handler_pc\t catch_type\t verbose\n");
            for (uint16_t i = 0; i < code.exception_table_length; i++) {
                ExceptionTable exceptionTable = code.exception_table[i];
                Utils::printTabs(out, indentation+2);
                fprintf(out,"%d\t ", i);
                fprintf(out,"%d\t ", exceptionTable.start_pc);
                fprintf(out,"%d\t ", exceptionTable.end_pc);
                fprintf(out,"%d\t ", exceptionTable.handler_pc);
                if (exceptionTable.catch_type == 0) {
                    fprintf(out,"0\n");
                } else {
                    fprintf(out,"cp_info #%d\t ", exceptionTable.catch_type);
                    fprintf(out,"%s\n", getFormattedConstant(constantPool, exceptionTable.catch_type));
                }
            }
        } else {
            fprintf(out,"Exception table is empty.\n");
        }
        
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Bytecode:\n");
        printByteCode(code, constantPool, indentation+2);
        
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Attributes:\n");
        for (uint16_t i = 0; i < code.attributes_count; i++) {
            print_AttributeInfo(code.attributes[i], i, constantPool, indentation+2);
        }
    } else if (Utils::compareUtf8WithString(attributeUtf8, "Exceptions")) {
        Exceptions_attribute exceptionsAttr = attributeInfo.info.exceptions_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Nr.\t exception\t verbose\n");
        for (uint16_t i = 0; i < exceptionsAttr.number_of_exceptions; i++) {
            Utils::printTabs(out, indentation+1);
            fprintf(out,"%d\t ", i);
            fprintf(out,"cp_info #%d\t ", exceptionsAttr.exception_index_table[i]);
            fprintf(out,"%s\n", getFormattedConstant(constantPool, exceptionsAttr.exception_index_table[i]));
        }
    } else if (Utils::compareUtf8WithString(attributeUtf8, "InnerClasses")) {
        InnerClasses_attribute innerClassAttr = attributeInfo.info.innerClasses_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Nr.\t inner_class\t outer_class\t inner_name\t access flags\n");
        for (uint16_t i = 0; i < innerClassAttr.number_of_classes; i++) {
            Class innerClass = innerClassAttr.classes[i];
            Utils::printTabs(out, indentation+1);
            fprintf(out,"%d\t ", i);
            fprintf(out,"cp_info #%d <%s>\t ", innerClass.inner_class_info_index, getFormattedConstant(constantPool, innerClass.inner_class_info_index));
            fprintf(out,"cp_info #%d <%s>\t ", innerClass.outer_class_info_index, getFormattedConstant(constantPool, innerClass.outer_class_info_index));
            fprintf(out,"cp_info #%d <%s>\t ", innerClass.inner_name_index, getFormattedConstant(constantPool, innerClass.inner_name_index));
            fprintf(out,"0x%.4X [%s]\n", innerClass.inner_class_access_flags, getAccessFlags(innerClass.inner_class_access_flags));
        }
    } else if (Utils::compareUtf8WithString(attributeUtf8, "Synthetic")) {
        // vazio
    } else if (Utils::compareUtf8WithString(attributeUtf8, "SourceFile")) {
        SourceFile_attribute sourceFile = attributeInfo.info.sourceFile_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Constant value index:\t cp_info #%d <%s>\n", sourceFile.sourcefile_index, getFormattedConstant(constantPool, sourceFile.sourcefile_index));
    } else if (Utils::compareUtf8WithString(attributeUtf8, "LineNumberTable")) {
        LineNumberTable_attribute lineNumberTable = attributeInfo.info.lineNumberTable_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Nr.\t start_pc\t line_number\n");
        for (uint16_t i = 0; i < lineNumberTable.line_number_table_length; i++) {
            LineNumberTable table = lineNumberTable.line_number_table[i];
            Utils::printTabs(out, indentation+1);
            fprintf(out,"%d\t ", i);
            fprintf(out,"%d\t ", table.start_pc);
            fprintf(out,"%d\n", table.line_number);
        }
    } else if (Utils::compareUtf8WithString(attributeUtf8, "LocalVariableTable")) {
        LocalVariableTable_attribute localVariable = attributeInfo.info.localVariableTable_info;
        Utils::printTabs(out, indentation+1);
        fprintf(out,"Nr.\t start_pc\t length\t index\t name\t descriptor\n");
        for (uint16_t i = 0; i < localVariable.local_variable_table_length; i++) {
            LocalVariableTable variable = localVariable.localVariableTable[i];
            Utils::printTabs(out, indentation+1);
            fprintf(out,"%d\t ", i);
            fprintf(out,"%d\t ", variable.start_pc);
            fprintf(out,"%d\t ", variable.length);
            fprintf(out,"%d\t ", variable.index);
            fprintf(out,"cp_info #%d <%s>\t ", variable.name_index, getFormattedConstant(constantPool, variable.name_index));
            fprintf(out,"cp_info #%d <%s>\n", variable.descriptor_index, getFormattedConstant(constantPool, variable.descriptor_index));
        }
    } else if (Utils::compareUtf8WithString(attributeUtf8, "Deprecated")) {
        // vazio
    } else {
        cerr << "Arquivo .class possui uma um atributo invalido." << endl;
        exit(6);
    }
    fprintf(out, "\n");
}